

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IcePoint.cpp
# Opt level: O0

Point * __thiscall
IceMaths::Point::Refract(Point *this,Point *eye,Point *n,float refractindex,Point *refracted)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 local_14c;
  float NDotN;
  float NDotE;
  Point Env;
  Point *refracted_local;
  float refractindex_local;
  Point *n_local;
  Point *eye_local;
  Point *this_local;
  
  fVar2 = eye->x - this->x;
  fVar3 = eye->y - this->y;
  fVar4 = eye->z - this->z;
  fVar5 = n->z * n->z + n->x * n->x + n->y * n->y;
  fVar6 = (n->z * fVar4 + n->x * fVar2 + n->y * fVar3) / refractindex;
  fVar1 = n->z;
  local_14c._0_4_ = n->x * fVar6 - fVar2 * fVar5;
  local_14c._4_4_ = n->y * fVar6 - fVar3 * fVar5;
  local_14c._0_4_ = (float)local_14c;
  local_14c._4_4_ = SUB84(local_14c,4);
  refracted->x = (float)local_14c;
  refracted->y = local_14c._4_4_;
  refracted->z = fVar1 * fVar6 - fVar4 * fVar5;
  return this;
}

Assistant:

Point& Point::Refract(const Point& eye, const Point& n, float refractindex, Point& refracted)
{
	//	Point EyePt = eye position
	//	Point p = current vertex
	//	Point n = vertex normal
	//	Point rv = refracted vector
	//	Eye vector - doesn't need to be normalized
	Point Env;
	Env.x = eye.x - x;
	Env.y = eye.y - y;
	Env.z = eye.z - z;

	float NDotE = n|Env;
	float NDotN = n|n;
	NDotE /= refractindex;

	// Refracted vector
	refracted = n*NDotE - Env*NDotN;

	return *this;
}